

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t * Acb_NtkFindNodes2(Acb_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *vNodes_00;
  Vec_Int_t *vNodes;
  int iObj;
  int i;
  Acb_Ntk_t *p_local;
  
  vNodes_00 = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  for (vNodes._4_4_ = 0; iVar1 = Acb_NtkCoNum(p), vNodes._4_4_ < iVar1;
      vNodes._4_4_ = vNodes._4_4_ + 1) {
    iVar1 = Acb_NtkCo(p,vNodes._4_4_);
    iVar1 = Acb_ObjFanin(p,iVar1,0);
    Acb_NtkFindNodes2_rec(p,iVar1,vNodes_00);
  }
  return vNodes_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindNodes2( Acb_Ntk_t * p )
{
    int i, iObj;
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCo( p, iObj, i )
        Acb_NtkFindNodes2_rec( p, Acb_ObjFanin(p, iObj, 0), vNodes );
    return vNodes;
}